

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O0

metric_name __thiscall fasttext::Args::getAutotuneMetric(Args *this)

{
  bool bVar1;
  runtime_error *this_00;
  long in_RDI;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  string local_30 [44];
  metric_name local_4;
  
  std::__cxx11::string::substr((ulong)local_30,in_RDI + 0x158);
  bVar1 = std::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_30);
  if (bVar1) {
    local_4 = labelf1score;
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      std::runtime_error::runtime_error(this_00,local_60);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_4 = f1score;
  }
  return local_4;
}

Assistant:

metric_name Args::getAutotuneMetric() const {
  if (autotuneMetric.substr(0, 3) == "f1:") {
    return metric_name::labelf1score;
  } else if (autotuneMetric == "f1") {
    return metric_name::f1score;
  }
  throw std::runtime_error("Unknown metric : " + autotuneMetric);
}